

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommandlineparser.cpp
# Opt level: O3

void __thiscall
QCommandLineParser::addPositionalArgument
          (QCommandLineParser *this,QString *name,QString *description,QString *syntax)

{
  QList<QCommandLineParserPrivate::PositionalArgumentDefinition> *this_00;
  long in_FS_OFFSET;
  PositionalArgumentDefinition local_88;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_88.syntax.d.d = (Data *)0x0;
  local_88.syntax.d.ptr = (char16_t *)0x0;
  local_88.description.d.ptr = (char16_t *)0x0;
  local_88.description.d.size = 0;
  local_88.name.d.size = 0;
  local_88.description.d.d = (Data *)0x0;
  local_88.name.d.d = (Data *)0x0;
  local_88.name.d.ptr = (char16_t *)0x0;
  local_88.syntax.d.size = 0;
  QString::operator=(&local_88.name,name);
  QString::operator=(&local_88.description,description);
  if ((syntax->d).size == 0) {
    syntax = name;
  }
  QString::operator=(&local_88.syntax,syntax);
  this_00 = &this->d->positionalArgumentDefinitions;
  QtPrivate::QMovableArrayOps<QCommandLineParserPrivate::PositionalArgumentDefinition>::
  emplace<QCommandLineParserPrivate::PositionalArgumentDefinition_const&>
            ((QMovableArrayOps<QCommandLineParserPrivate::PositionalArgumentDefinition> *)this_00,
             (this->d->positionalArgumentDefinitions).d.size,&local_88);
  QList<QCommandLineParserPrivate::PositionalArgumentDefinition>::end(this_00);
  if (&(local_88.syntax.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_88.syntax.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_88.syntax.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_88.syntax.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
    {
      QArrayData::deallocate(&(local_88.syntax.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_88.description.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_88.description.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_88.description.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
         + -1;
    UNLOCK();
    if (((local_88.description.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
        == 0) {
      QArrayData::deallocate(&(local_88.description.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_88.name.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_88.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_88.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_88.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_88.name.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QCommandLineParser::addPositionalArgument(const QString &name, const QString &description, const QString &syntax)
{
    QCommandLineParserPrivate::PositionalArgumentDefinition arg;
    arg.name = name;
    arg.description = description;
    arg.syntax = syntax.isEmpty() ? name : syntax;
    d->positionalArgumentDefinitions.append(arg);
}